

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::AccessInstrumenter::create(AccessInstrumenter *this)

{
  AccessInstrumenter *this_00;
  long in_RSI;
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  local_50;
  
  this_00 = (AccessInstrumenter *)operator_new(0x138);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::_Rb_tree(&local_50,
             (_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
              *)(in_RSI + 0x108));
  AccessInstrumenter(this_00,(set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_> *)
                             &local_50);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_50);
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::AccessInstrumenter,_wasm::Visitor<wasm::AccessInstrumenter,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)this_00;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<AccessInstrumenter>(ignoreFunctions);
  }